

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O1

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::BuildGraphWithoutRecurrentTerm
          (ScalarEvolutionAnalysis *this,SENode *node,Loop *loop)

{
  pointer ppSVar1;
  iterator iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SENode *pSVar5;
  vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *__range2;
  pointer ppSVar6;
  SENode **ppSVar7;
  vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> new_children;
  SENode *itr;
  SENode **local_68;
  iterator iStack_60;
  SENode **local_58;
  SENode *local_48;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_40;
  SENode *local_38;
  long lVar4;
  
  iVar3 = (*node->_vptr_SENode[6])(node);
  lVar4 = CONCAT44(extraout_var,iVar3);
  if (lVar4 == 0) {
    local_68 = (SENode **)0x0;
    iStack_60._M_current = (SENode **)0x0;
    local_58 = (SENode **)0x0;
    ppSVar6 = (node->children_).
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar1 = (node->children_).
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar6 != ppSVar1) {
      do {
        local_48 = *ppSVar6;
        iVar3 = (*local_48->_vptr_SENode[6])();
        lVar4 = CONCAT44(extraout_var_00,iVar3);
        if ((lVar4 == 0) || (*(Loop **)(lVar4 + 0x40) != loop)) {
          if (iStack_60._M_current == local_58) {
            std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>::
            _M_realloc_insert<spvtools::opt::SENode*const&>
                      ((vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>> *)
                       &local_68,iStack_60,&local_48);
          }
          else {
            *iStack_60._M_current = local_48;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
        }
        else {
          local_38 = *(SENode **)(lVar4 + 0x38);
          std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>::
          emplace_back<spvtools::opt::SENode*>
                    ((vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>> *)
                     &local_68,&local_38);
        }
        ppSVar6 = ppSVar6 + 1;
      } while (ppSVar6 != ppSVar1);
    }
    pSVar5 = (SENode *)operator_new(0x30);
    iVar2._M_current = iStack_60._M_current;
    pSVar5->_vptr_SENode = (_func_int **)&PTR___cxa_pure_virtual_00951a38;
    (pSVar5->children_).
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar5->children_).
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar5->children_).
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar5->parent_analysis_ = this;
    SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
    pSVar5->unique_id_ = SENode::NumberOfNodes;
    pSVar5->_vptr_SENode = (_func_int **)&PTR_GetType_00951db8;
    for (ppSVar7 = local_68; ppSVar7 != iVar2._M_current; ppSVar7 = ppSVar7 + 1) {
      (*pSVar5->_vptr_SENode[3])(pSVar5,*ppSVar7);
    }
    local_40._M_head_impl = pSVar5;
    pSVar5 = GetCachedOrAdd(this,(unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                  *)&local_40);
    node = SimplifyExpression(this,pSVar5);
    if (local_40._M_head_impl != (SENode *)0x0) {
      (*(local_40._M_head_impl)->_vptr_SENode[2])();
    }
    local_40._M_head_impl = (SENode *)0x0;
    if (local_68 != (SENode **)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
  }
  else if (*(Loop **)(lVar4 + 0x40) == loop) {
    node = *(SENode **)(lVar4 + 0x38);
  }
  return node;
}

Assistant:

SENode* ScalarEvolutionAnalysis::BuildGraphWithoutRecurrentTerm(
    SENode* node, const Loop* loop) {
  // If the node is already a recurrent expression belonging to loop then just
  // return the offset.
  SERecurrentNode* recurrent = node->AsSERecurrentNode();
  if (recurrent) {
    if (recurrent->GetLoop() == loop) {
      return recurrent->GetOffset();
    } else {
      return node;
    }
  }

  std::vector<SENode*> new_children;
  // Otherwise find the recurrent node in the children of this node.
  for (auto itr : *node) {
    recurrent = itr->AsSERecurrentNode();
    if (recurrent && recurrent->GetLoop() == loop) {
      new_children.push_back(recurrent->GetOffset());
    } else {
      new_children.push_back(itr);
    }
  }

  std::unique_ptr<SENode> add_node{new SEAddNode(this)};
  for (SENode* child : new_children) {
    add_node->AddChild(child);
  }

  return SimplifyExpression(GetCachedOrAdd(std::move(add_node)));
}